

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
* __thiscall
Catch::ExprLhs<trng::lagfib2plus<unsigned_int,168u,521u>const&>::operator!=
          (BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
           *__return_storage_ptr__,ExprLhs<trng::lagfib2plus<unsigned_int,168u,521u>const&> *this,
          lagfib2plus<unsigned_int,_168U,_521U> *rhs)

{
  lagfib2plus<unsigned_int,_168U,_521U> *plVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator!=(*(lagfib2plus<unsigned_int,_168U,_521U> **)this,rhs);
  plVar1 = *(lagfib2plus<unsigned_int,_168U,_521U> **)this;
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002ea110;
  __return_storage_ptr__->m_lhs = plVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }